

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cpp
# Opt level: O0

int __thiscall
xercesc_4_0::RegularExpression::matchCapture
          (RegularExpression *this,Context *context,Op *op,XMLSize_t offset)

{
  int index_00;
  Op *pOVar1;
  int local_4c;
  int ret;
  int ret_1;
  int save;
  XMLInt32 index;
  XMLSize_t offset_local;
  Op *op_local;
  Context *context_local;
  RegularExpression *this_local;
  
  index_00 = (*op->_vptr_Op[2])();
  if (index_00 < 1) {
    local_4c = Match::getEndPos(context->fMatch,-index_00);
  }
  else {
    local_4c = Match::getStartPos(context->fMatch,index_00);
  }
  if (index_00 < 1) {
    Match::setEndPos(context->fMatch,-index_00,(int)offset);
    pOVar1 = Op::getNextOp(op);
    this_local._4_4_ = match(this,context,pOVar1,offset);
    if (this_local._4_4_ < 0) {
      Match::setEndPos(context->fMatch,-index_00,local_4c);
    }
  }
  else {
    Match::setStartPos(context->fMatch,index_00,(int)offset);
    pOVar1 = Op::getNextOp(op);
    this_local._4_4_ = match(this,context,pOVar1,offset);
    if (this_local._4_4_ < 0) {
      Match::setStartPos(context->fMatch,index_00,local_4c);
    }
  }
  return this_local._4_4_;
}

Assistant:

int RegularExpression::matchCapture(Context* const context, const Op* const op,
                                    XMLSize_t offset) const
{
    // No check is made for nullness of fMatch as the function is only called if
    // fMatch is not null.
    XMLInt32 index = op->getData();
    int save = (index > 0) ? context->fMatch->getStartPos(index)
                           : context->fMatch->getEndPos(-index);

    if (index > 0) {
        context->fMatch->setStartPos(index, (int)offset);
        int ret = match(context, op->getNextOp(), offset);
        if (ret < 0)
            context->fMatch->setStartPos(index, save);
        return ret;
    }

    context->fMatch->setEndPos(-index, (int)offset);
    int ret = match(context, op->getNextOp(), offset);
    if (ret < 0)
        context->fMatch->setEndPos(-index, save);
    return ret;
}